

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O3

void __thiscall ipx::IPM::Centring(IPM *this,Step *step,double mu)

{
  Iterate *pIVar1;
  Iterate *this_00;
  pointer pSVar2;
  double *rb;
  double *rc;
  double *rl;
  double *sl;
  double *su;
  Vector *pVVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  pIVar1 = this->iterate_;
  uVar5 = (long)pIVar1->model_->num_cols_ + (long)pIVar1->model_->num_rows_;
  uVar4 = uVar5 * 8;
  sl = (double *)operator_new(uVar4);
  memset(sl,0,uVar4);
  su = (double *)operator_new(uVar4);
  memset(su,0,uVar4);
  this_00 = this->iterate_;
  if (0 < (int)uVar5) {
    pSVar2 = (this_00->variable_state_).
             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      dVar6 = 0.0;
      if ((pSVar2[uVar4] & ~BARRIER_BOXED) == BARRIER_LB) {
        dVar6 = mu - (pIVar1->xl_)._M_data[uVar4] * (pIVar1->zl_)._M_data[uVar4];
      }
      sl[uVar4] = dVar6;
      uVar4 = uVar4 + 1;
    } while ((uVar5 & 0xffffffff) != uVar4);
    if (0 < (int)uVar5) {
      pSVar2 = (this_00->variable_state_).
               super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = 0;
      do {
        dVar6 = 0.0;
        if (pSVar2[uVar4] - BARRIER_UB < 2) {
          dVar6 = mu - (pIVar1->xu_)._M_data[uVar4] * (pIVar1->zu_)._M_data[uVar4];
        }
        su[uVar4] = dVar6;
        uVar4 = uVar4 + 1;
      } while ((uVar5 & 0xffffffff) != uVar4);
    }
  }
  pVVar3 = Iterate::rb(this_00);
  rb = pVVar3->_M_data;
  pVVar3 = Iterate::rc(this->iterate_);
  rc = pVVar3->_M_data;
  pVVar3 = Iterate::rl(this->iterate_);
  rl = pVVar3->_M_data;
  pVVar3 = Iterate::ru(this->iterate_);
  SolveNewtonSystem(this,rb,rc,rl,pVVar3->_M_data,sl,su,step);
  operator_delete(su);
  operator_delete(sl);
  return;
}

Assistant:

void IPM::Centring(Step& step, double mu) {
  const Model& model = iterate_->model();
  const Int m = model.rows();
  const Int n = model.cols();
  const Vector& xl = iterate_->xl();
  const Vector& xu = iterate_->xu();
  const Vector& zl = iterate_->zl();
  const Vector& zu = iterate_->zu();

  Vector sl(n + m);
  Vector su(n + m);

  // Set sigma to 1 for pure centring
  const double sigma = 1.0;

  // sl = -xl.*zl + sigma*mu
  for (Int j = 0; j < n + m; j++) {
    if (iterate_->has_barrier_lb(j)) {
      sl[j] = -xl[j] * zl[j] + sigma * mu;
    } else {
      sl[j] = 0.0;
    }
  }
  assert(AllFinite(sl));

  // su = -xu.*zu + sigma*mu
  for (Int j = 0; j < n + m; j++) {
    if (iterate_->has_barrier_ub(j)) {
      su[j] = -xu[j] * zu[j] + sigma * mu;
    } else {
      su[j] = 0.0;
    }
  }
  assert(AllFinite(su));

  SolveNewtonSystem(&iterate_->rb()[0], &iterate_->rc()[0], &iterate_->rl()[0],
                    &iterate_->ru()[0], &sl[0], &su[0], step);
}